

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase263::run(TestCase263 *this)

{
  bool bVar1;
  Which WVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t local_528;
  Schema local_520;
  Reader local_518;
  uint64_t local_4e8;
  bool local_4d9;
  bool _kj_shouldLog_11;
  Reader local_4d0;
  bool local_499;
  bool _kj_shouldLog_10;
  Schema local_490;
  Schema local_488;
  Reader local_480;
  ArrayPtr<const_char> local_450;
  bool local_439;
  bool _kj_shouldLog_9;
  Reader local_430;
  ArrayPtr<const_char> local_400;
  Schema local_3f0;
  Reader local_3e8;
  ArrayPtr<const_char> local_3b8;
  bool local_3a1;
  bool _kj_shouldLog_8;
  Reader local_398;
  ArrayPtr<const_char> local_368;
  Schema local_358;
  Reader local_350;
  ArrayPtr<const_char> local_320;
  bool local_309;
  bool _kj_shouldLog_7;
  Reader local_300;
  ArrayPtr<const_char> local_2d0;
  Schema local_2c0;
  Reader local_2b8;
  ArrayPtr<const_char> local_288;
  bool local_271;
  bool _kj_shouldLog_6;
  Reader local_268;
  ArrayPtr<const_char> local_238;
  Schema local_228;
  Reader local_220;
  ArrayPtr<const_char> local_1f0;
  bool local_1d9;
  bool _kj_shouldLog_5;
  Reader local_1d0;
  ArrayPtr<const_char> local_1a0;
  bool local_189;
  bool _kj_shouldLog_4;
  Reader local_180;
  bool local_149;
  bool _kj_shouldLog_3;
  Reader local_140;
  bool local_109;
  bool _kj_shouldLog_2;
  Reader local_100;
  bool local_c9;
  bool _kj_shouldLog_1;
  Reader local_c0;
  Schema local_90;
  Reader local_88;
  uint local_54 [2];
  bool local_49;
  bool _kj_shouldLog;
  Reader local_40;
  TestCase263 *local_10;
  TestCase263 *this_local;
  
  local_10 = this;
  Schema::Schema((Schema *)&stack0xffffffffffffffb8);
  Schema::getProto(&local_40,(Schema *)&stack0xffffffffffffffb8);
  WVar2 = capnp::schema::Node::Reader::which(&local_40);
  if (WVar2 != 0xff) {
    local_49 = kj::_::Debug::shouldLog(ERROR);
    while (local_49 != false) {
      local_54[1] = 0xff;
      Schema::Schema(&local_90);
      Schema::getProto(&local_88,&local_90);
      WVar2 = capnp::schema::Node::Reader::which(&local_88);
      local_54[0] = (uint)WVar2;
      kj::_::Debug::log<char_const(&)[63],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x108,ERROR,
                 "\"failed: expected \" \"(0xff) == ((uint)Schema().getProto().which())\", 0xff, (uint)Schema().getProto().which()"
                 ,(char (*) [63])"failed: expected (0xff) == ((uint)Schema().getProto().which())",
                 (int *)(local_54 + 1),local_54);
      local_49 = false;
    }
  }
  StructSchema::StructSchema((StructSchema *)&stack0xffffffffffffff38);
  Schema::getProto(&local_c0,(Schema *)&stack0xffffffffffffff38);
  bVar1 = capnp::schema::Node::Reader::isStruct(&local_c0);
  if (!bVar1) {
    local_c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_c9 != false) {
      kj::_::Debug::log<char_const(&)[54]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x109,ERROR,"\"failed: expected \" \"StructSchema().getProto().isStruct()\"",
                 (char (*) [54])"failed: expected StructSchema().getProto().isStruct()");
      local_c9 = false;
    }
  }
  EnumSchema::EnumSchema((EnumSchema *)&stack0xfffffffffffffef8);
  Schema::getProto(&local_100,(Schema *)&stack0xfffffffffffffef8);
  bVar1 = capnp::schema::Node::Reader::isEnum(&local_100);
  if (!bVar1) {
    local_109 = kj::_::Debug::shouldLog(ERROR);
    while (local_109 != false) {
      kj::_::Debug::log<char_const(&)[50]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x10a,ERROR,"\"failed: expected \" \"EnumSchema().getProto().isEnum()\"",
                 (char (*) [50])"failed: expected EnumSchema().getProto().isEnum()");
      local_109 = false;
    }
  }
  InterfaceSchema::InterfaceSchema((InterfaceSchema *)&stack0xfffffffffffffeb8);
  Schema::getProto(&local_140,(Schema *)&stack0xfffffffffffffeb8);
  bVar1 = capnp::schema::Node::Reader::isInterface(&local_140);
  if (!bVar1) {
    local_149 = kj::_::Debug::shouldLog(ERROR);
    while (local_149 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x10b,ERROR,"\"failed: expected \" \"InterfaceSchema().getProto().isInterface()\""
                 ,(char (*) [60])"failed: expected InterfaceSchema().getProto().isInterface()");
      local_149 = false;
    }
  }
  ConstSchema::ConstSchema((ConstSchema *)&stack0xfffffffffffffe78);
  Schema::getProto(&local_180,(Schema *)&stack0xfffffffffffffe78);
  bVar1 = capnp::schema::Node::Reader::isConst(&local_180);
  if (!bVar1) {
    local_189 = kj::_::Debug::shouldLog(ERROR);
    while (local_189 != false) {
      kj::_::Debug::log<char_const(&)[52]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x10c,ERROR,"\"failed: expected \" \"ConstSchema().getProto().isConst()\"",
                 (char (*) [52])"failed: expected ConstSchema().getProto().isConst()");
      local_189 = false;
    }
  }
  Schema::Schema((Schema *)&stack0xfffffffffffffe28);
  Schema::getProto(&local_1d0,(Schema *)&stack0xfffffffffffffe28);
  local_1a0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_1d0);
  bVar1 = kj::operator==("(null schema)",(StringPtr *)&local_1a0);
  if (!bVar1) {
    local_1d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d9 != false) {
      Schema::Schema(&local_228);
      Schema::getProto(&local_220,&local_228);
      local_1f0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_220);
      kj::_::Debug::log<char_const(&)[77],char_const(&)[14],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x10e,ERROR,
                 "\"failed: expected \" \"(\\\"(null schema)\\\") == (Schema().getProto().getDisplayName())\", \"(null schema)\", Schema().getProto().getDisplayName()"
                 ,(char (*) [77])
                  "failed: expected (\"(null schema)\") == (Schema().getProto().getDisplayName())",
                 (char (*) [14])"(null schema)",(Reader *)&local_1f0);
      local_1d9 = false;
    }
  }
  StructSchema::StructSchema((StructSchema *)&stack0xfffffffffffffd90);
  Schema::getProto(&local_268,(Schema *)&stack0xfffffffffffffd90);
  local_238 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_268);
  bVar1 = kj::operator==("(null struct schema)",(StringPtr *)&local_238);
  if (!bVar1) {
    local_271 = kj::_::Debug::shouldLog(ERROR);
    while (local_271 != false) {
      StructSchema::StructSchema((StructSchema *)&local_2c0);
      Schema::getProto(&local_2b8,&local_2c0);
      local_288 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_2b8);
      kj::_::Debug::log<char_const(&)[90],char_const(&)[21],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x10f,ERROR,
                 "\"failed: expected \" \"(\\\"(null struct schema)\\\") == (StructSchema().getProto().getDisplayName())\", \"(null struct schema)\", StructSchema().getProto().getDisplayName()"
                 ,(char (*) [90])
                  "failed: expected (\"(null struct schema)\") == (StructSchema().getProto().getDisplayName())"
                 ,(char (*) [21])"(null struct schema)",(Reader *)&local_288);
      local_271 = false;
    }
  }
  EnumSchema::EnumSchema((EnumSchema *)&stack0xfffffffffffffcf8);
  Schema::getProto(&local_300,(Schema *)&stack0xfffffffffffffcf8);
  local_2d0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_300);
  bVar1 = kj::operator==("(null enum schema)",(StringPtr *)&local_2d0);
  if (!bVar1) {
    local_309 = kj::_::Debug::shouldLog(ERROR);
    while (local_309 != false) {
      EnumSchema::EnumSchema((EnumSchema *)&local_358);
      Schema::getProto(&local_350,&local_358);
      local_320 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_350);
      kj::_::Debug::log<char_const(&)[86],char_const(&)[19],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x110,ERROR,
                 "\"failed: expected \" \"(\\\"(null enum schema)\\\") == (EnumSchema().getProto().getDisplayName())\", \"(null enum schema)\", EnumSchema().getProto().getDisplayName()"
                 ,(char (*) [86])
                  "failed: expected (\"(null enum schema)\") == (EnumSchema().getProto().getDisplayName())"
                 ,(char (*) [19])"(null enum schema)",(Reader *)&local_320);
      local_309 = false;
    }
  }
  InterfaceSchema::InterfaceSchema((InterfaceSchema *)&stack0xfffffffffffffc60);
  Schema::getProto(&local_398,(Schema *)&stack0xfffffffffffffc60);
  local_368 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_398);
  bVar1 = kj::operator==("(null interface schema)",(StringPtr *)&local_368);
  if (!bVar1) {
    local_3a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3a1 != false) {
      InterfaceSchema::InterfaceSchema((InterfaceSchema *)&local_3f0);
      Schema::getProto(&local_3e8,&local_3f0);
      local_3b8 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_3e8);
      kj::_::Debug::log<char_const(&)[96],char_const(&)[24],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x111,ERROR,
                 "\"failed: expected \" \"(\\\"(null interface schema)\\\") == (InterfaceSchema().getProto().getDisplayName())\", \"(null interface schema)\", InterfaceSchema().getProto().getDisplayName()"
                 ,(char (*) [96])
                  "failed: expected (\"(null interface schema)\") == (InterfaceSchema().getProto().getDisplayName())"
                 ,(char (*) [24])"(null interface schema)",(Reader *)&local_3b8);
      local_3a1 = false;
    }
  }
  ConstSchema::ConstSchema((ConstSchema *)&stack0xfffffffffffffbc8);
  Schema::getProto(&local_430,(Schema *)&stack0xfffffffffffffbc8);
  local_400 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_430);
  bVar1 = kj::operator==("(null const schema)",(StringPtr *)&local_400);
  if (!bVar1) {
    local_439 = kj::_::Debug::shouldLog(ERROR);
    while (local_439 != false) {
      ConstSchema::ConstSchema((ConstSchema *)&local_488);
      Schema::getProto(&local_480,&local_488);
      local_450 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_480);
      kj::_::Debug::log<char_const(&)[88],char_const(&)[20],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x112,ERROR,
                 "\"failed: expected \" \"(\\\"(null const schema)\\\") == (ConstSchema().getProto().getDisplayName())\", \"(null const schema)\", ConstSchema().getProto().getDisplayName()"
                 ,(char (*) [88])
                  "failed: expected (\"(null const schema)\") == (ConstSchema().getProto().getDisplayName())"
                 ,(char (*) [20])"(null const schema)",(Reader *)&local_450);
      local_439 = false;
    }
  }
  local_490.raw = (RawBrandedSchema *)Schema::from<capnp::Capability>();
  InterfaceSchema::InterfaceSchema((InterfaceSchema *)&stack0xfffffffffffffb68);
  bVar1 = Schema::operator==(&local_490,(Schema *)&stack0xfffffffffffffb68);
  if (!bVar1) {
    local_499 = kj::_::Debug::shouldLog(ERROR);
    while (local_499 != false) {
      kj::_::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x114,ERROR,
                 "\"failed: expected \" \"Schema::from<Capability>() == InterfaceSchema()\"",
                 (char (*) [65])"failed: expected Schema::from<Capability>() == InterfaceSchema()");
      local_499 = false;
    }
  }
  InterfaceSchema::InterfaceSchema((InterfaceSchema *)&stack0xfffffffffffffb28);
  Schema::getProto(&local_4d0,(Schema *)&stack0xfffffffffffffb28);
  uVar3 = capnp::schema::Node::Reader::getId(&local_4d0);
  uVar4 = typeId<capnp::Capability,capnp::Capability::_capnpPrivate>();
  if (uVar3 != uVar4) {
    local_4d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4d9 != false) {
      InterfaceSchema::InterfaceSchema((InterfaceSchema *)&local_520);
      Schema::getProto(&local_518,&local_520);
      local_4e8 = capnp::schema::Node::Reader::getId(&local_518);
      local_528 = typeId<capnp::Capability,capnp::Capability::_capnpPrivate>();
      kj::_::Debug::log<char_const(&)[82],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x115,ERROR,
                 "\"failed: expected \" \"(InterfaceSchema().getProto().getId()) == (typeId<Capability>())\", InterfaceSchema().getProto().getId(), typeId<Capability>()"
                 ,(char (*) [82])
                  "failed: expected (InterfaceSchema().getProto().getId()) == (typeId<Capability>())"
                 ,&local_4e8,&local_528);
      local_4d9 = false;
    }
  }
  return;
}

Assistant:

TEST(Schema, NullSchemas) {
  EXPECT_EQ(0xff, (uint)Schema().getProto().which());
  EXPECT_TRUE(StructSchema().getProto().isStruct());
  EXPECT_TRUE(EnumSchema().getProto().isEnum());
  EXPECT_TRUE(InterfaceSchema().getProto().isInterface());
  EXPECT_TRUE(ConstSchema().getProto().isConst());

  EXPECT_EQ("(null schema)", Schema().getProto().getDisplayName());
  EXPECT_EQ("(null struct schema)", StructSchema().getProto().getDisplayName());
  EXPECT_EQ("(null enum schema)", EnumSchema().getProto().getDisplayName());
  EXPECT_EQ("(null interface schema)", InterfaceSchema().getProto().getDisplayName());
  EXPECT_EQ("(null const schema)", ConstSchema().getProto().getDisplayName());

  EXPECT_TRUE(Schema::from<Capability>() == InterfaceSchema());
  EXPECT_EQ(InterfaceSchema().getProto().getId(), typeId<Capability>());
}